

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O1

void rifft2d(float *data,long M2,long M)

{
  xdouble *pxVar1;
  ulong uVar2;
  xdouble *indata;
  long lVar3;
  ulong iRsiz;
  long lVar4;
  
  if (M < 1 || M2 < 1) {
    M = M + M2;
    lVar4 = 1;
    goto LAB_00102491;
  }
  if (M == 2) {
    lVar3 = 1L << (M2 & 0x3fU);
    dxpose((xdouble *)data,2,(xdouble *)Array2d[M2],lVar3,lVar3,1);
    riffts(Array2d[M2],M2,2);
    lVar4 = 2L << (M2 & 0x3fU);
    xpose(Array2d[M2],lVar3,Array2d[M2] + lVar4,2,2,lVar3);
    dxpose((xdouble *)(Array2d[M2] + lVar4),lVar3,(xdouble *)data,2,1,lVar3);
    pxVar1 = (xdouble *)(data + 2);
    dxpose(pxVar1,2,(xdouble *)Array2d[M2],lVar3,lVar3,1);
    iffts(Array2d[M2],M2,1);
    indata = (xdouble *)Array2d[M2];
    lVar4 = 2;
LAB_00102475:
    dxpose(indata,lVar3,pxVar1,lVar4,1,lVar3);
  }
  else {
    if (M == 1) {
      lVar3 = 1L << (M2 & 0x3fU);
      dxpose((xdouble *)data,1,(xdouble *)Array2d[M2],lVar3,lVar3,1);
      riffts(Array2d[M2],M2,2);
      lVar4 = 2L << (M2 & 0x3fU);
      xpose(Array2d[M2],lVar3,Array2d[M2] + lVar4,2,2,lVar3);
      indata = (xdouble *)(Array2d[M2] + lVar4);
      lVar4 = 1;
      pxVar1 = (xdouble *)data;
      goto LAB_00102475;
    }
    iRsiz = (ulong)(1L << (M & 0x3fU)) >> 1;
    lVar3 = 1L << (M2 & 0x3fU);
    dxpose((xdouble *)data,iRsiz,(xdouble *)Array2d[M2],lVar3,lVar3,1);
    riffts(Array2d[M2],M2,2);
    lVar4 = 2L << (M2 & 0x3fU);
    xpose(Array2d[M2],lVar3,Array2d[M2] + lVar4,2,2,lVar3);
    dxpose((xdouble *)(Array2d[M2] + lVar4),lVar3,(xdouble *)data,iRsiz,1,lVar3);
    dxpose((xdouble *)(data + 2),iRsiz,(xdouble *)Array2d[M2],lVar3,lVar3,3);
    iffts(Array2d[M2],M2,3);
    dxpose((xdouble *)Array2d[M2],lVar3,(xdouble *)(data + 2),iRsiz,3,lVar3);
    if (3 < (ulong)M) {
      uVar2 = 4;
      pxVar1 = (xdouble *)data;
      do {
        pxVar1 = pxVar1 + 4;
        dxpose(pxVar1,iRsiz,(xdouble *)Array2d[M2],lVar3,lVar3,4);
        iffts(Array2d[M2],M2,4);
        dxpose((xdouble *)Array2d[M2],lVar3,pxVar1,iRsiz,4,lVar3);
        uVar2 = uVar2 + 4;
      } while (uVar2 < iRsiz);
    }
  }
  lVar4 = 1L << (M2 & 0x3fU);
LAB_00102491:
  riffts(data,M,lVar4);
  return;
}

Assistant:

void rifft2d(float *data, long M2, long M){
/* Compute 2D real ifft and return results in-place	*/
/* The input must be in the order as outout from rfft2d */
/* INPUTS */
/* *data = input data array	*/
/* M2 = log2 of fft size number of rows out */
/* M = log2 of fft size number of columns out */
/* OUTPUTS */
/* *data = output data array	*/
long i1;
if((M2>0)&&(M>0)){
	if (M==1){
		cxpose(data, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		riffts(Array2d[M2], M2, 2);
		xpose(Array2d[M2], POW2(M2), Array2d[M2]+POW2(M2)*2, 2, 2, POW2(M2));
		cxpose(Array2d[M2]+POW2(M2)*2, POW2(M2), data, POW2(M)/2, 1, POW2(M2));
	}
	else if (M==2){
		cxpose(data, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		riffts(Array2d[M2], M2, 2);
		xpose(Array2d[M2], POW2(M2), Array2d[M2]+POW2(M2)*2, 2, 2, POW2(M2)); 
		cxpose(Array2d[M2]+POW2(M2)*2, POW2(M2), data, POW2(M)/2, 1, POW2(M2));

		cxpose(data + 2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		iffts(Array2d[M2], M2, 1);
		cxpose(Array2d[M2], POW2(M2), data + 2, POW2(M)/2, 1, POW2(M2));
	}
	else{
		cxpose(data, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		riffts(Array2d[M2], M2, 2);
		xpose(Array2d[M2], POW2(M2), Array2d[M2]+POW2(M2)*2, 2, 2, POW2(M2));
		cxpose(Array2d[M2]+POW2(M2)*2, POW2(M2), data, POW2(M)/2, 1, POW2(M2));

		cxpose(data + 2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 3);
		iffts(Array2d[M2], M2, 3);
		cxpose(Array2d[M2], POW2(M2), data + 2, POW2(M)/2, 3, POW2(M2));
		for (i1=4; i1<POW2(M)/2; i1+=4){
			cxpose(data + i1*2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 4);
			iffts(Array2d[M2], M2, 4);
			cxpose(Array2d[M2], POW2(M2), data + i1*2, POW2(M)/2, 4, POW2(M2));
		}
	}
	riffts(data, M, POW2(M2));
}
else
	riffts(data, M2+M, 1);
}